

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
poly::
vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
::
push_back_new_elem_w_storage_increase<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>>
          (vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
           *this,long param_2)

{
  long lVar1;
  undefined8 *puVar2;
  void_pointer pvVar3;
  __atomic_base<unsigned_long> _Var4;
  long lVar5;
  undefined8 uVar6;
  long v_1;
  ulong uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  long v_3;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  undefined8 *puVar16;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
  v;
  undefined1 local_79;
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  local_78;
  undefined8 *local_68;
  undefined8 *puStack_60;
  ulong local_58;
  undefined8 *local_48;
  long local_40;
  vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
  *local_38;
  
  lVar5 = *(long *)this;
  lVar12 = *(long *)(this + 0x10);
  uVar15 = 1;
  if (0x27 < (ulong)(*(long *)(this + 0x18) - lVar5)) {
    uVar15 = (ulong)(*(long *)(this + 0x18) - lVar5) / 0x14 & 0xfffffffffffffffe;
  }
  uVar9 = 0x40;
  if (0x40 < *(ulong *)(this + 0x20)) {
    uVar9 = *(ulong *)(this + 0x20);
  }
  lVar1 = uVar9 - 1;
  uVar13 = uVar9;
  for (lVar14 = lVar5; lVar14 != lVar12; lVar14 = lVar14 + 0x28) {
    uVar10 = *(long *)(lVar14 + 0x18) + lVar1;
    uVar13 = (uVar13 - uVar10 % uVar9) + uVar10;
  }
  uVar7 = (uVar9 - (uVar9 + 0xff) % uVar9) + 0xff;
  uVar10 = uVar7;
  if (lVar5 != lVar12) {
    lVar14 = (lVar12 - lVar5 >> 3) * -0x3333333333333333;
    uVar10 = (lVar14 + uVar13 + uVar7) / (lVar14 + 1U);
  }
  lVar12 = lVar12 - lVar5 >> 3;
  lVar5 = 0;
  if ((ulong)(lVar12 * -0x3333333333333333) <= uVar15) {
    lVar5 = uVar15 + lVar12 * 0x3333333333333333;
  }
  local_68 = (undefined8 *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_78._storage = (undefined8 *)0x0;
  local_78._end_storage = (void_pointer)0x0;
  local_58 = 8;
  local_40 = param_2;
  vector_impl::
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  ::allocate(&local_78,uVar7 + uVar15 * 0x28 + uVar13 + lVar5 * uVar10);
  puVar16 = (undefined8 *)local_78._storage;
  local_68 = (undefined8 *)local_78._storage;
  puStack_60 = (undefined8 *)((long)local_78._storage + uVar15 * 5 * 8);
  puVar11 = *(undefined8 **)this;
  puVar2 = *(undefined8 **)(this + 0x10);
  local_58 = uVar9;
  local_48 = puStack_60;
  local_38 = this;
  if (uVar15 != 0) {
    memset(local_78._storage,0,((uVar15 * 0x28 - 0x28) / 0x28) * 0x28 + 0x28);
  }
  if (puVar11 != puVar2) {
    puVar8 = local_48;
    do {
      *puVar16 = *puVar11;
      puVar16[1] = puVar11[1];
      puVar16[2] = puVar11[2];
      puVar16[3] = puVar11[3];
      puVar16[4] = puVar11[4];
      lVar5 = (lVar1 - (ulong)((long)puVar8 + lVar1) % uVar9) + (long)puVar8;
      puVar16[1] = lVar5;
      uVar6 = (*(code *)*puVar11)(&local_79,puVar11[2],lVar5,1);
      puVar16[2] = uVar6;
      puVar8 = (undefined8 *)(puVar16[1] + puVar16[3]);
      puVar11 = puVar11 + 5;
      puVar16 = puVar16 + 5;
    } while (puVar11 != puVar2);
  }
  puStack_60 = local_48;
  if ((puVar16 != local_48) && (0x3f < local_58)) {
    puVar11 = local_48;
    if (puVar16 != (undefined8 *)local_78._storage) {
      puVar11 = (undefined8 *)(puVar16[-4] + puVar16[-2]);
    }
    if ((void_pointer)
        ((long)puVar11 + (local_58 - ((long)puVar11 + (local_58 - 1)) % local_58) + 0xff) <=
        local_78._end_storage) {
      puVar11 = local_48;
      if (puVar16 != (undefined8 *)local_78._storage) {
        puVar11 = (undefined8 *)(puVar16[-4] + puVar16[-2]);
      }
      lVar5 = (local_58 - 1) - ((local_58 - 1) + (long)puVar11) % local_58;
      *(undefined ***)((long)puVar11 + lVar5) = &PTR___cxa_pure_virtual_002bf808;
      LOCK();
      UNLOCK();
      _Var4._M_i = (Interface::last_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
      ((__atomic_base<unsigned_long> *)((long)puVar11 + lVar5 + 8))->_M_i =
           (__int_type)Interface::last_id.super___atomic_base<unsigned_long>._M_i;
      Interface::last_id.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
      *(undefined1 *)((long)puVar11 + lVar5 + 0x10) = 0;
      *(undefined ***)((long)puVar11 + lVar5) = &PTR_function_002bf840;
      *(undefined8 *)((long)puVar11 + lVar5 + 0x18) = *(undefined8 *)(local_40 + 0x18);
      *(undefined8 *)((long)puVar11 + lVar5 + 0x20) = *(undefined8 *)(local_40 + 0x20);
      *(undefined8 *)(local_40 + 0x18) = 0;
      *(undefined8 *)(local_40 + 0x20) = 0;
      *(undefined8 *)((long)puVar11 + lVar5 + 0x28) = *(undefined8 *)(local_40 + 0x28);
      *(undefined8 *)((long)puVar11 + lVar5 + 0x30) = *(undefined8 *)(local_40 + 0x30);
      *(undefined8 *)((long)puVar11 + lVar5 + 0x38) = *(undefined8 *)(local_40 + 0x38);
      *(undefined8 *)(local_40 + 0x28) = 0;
      *(undefined8 *)(local_40 + 0x30) = 0;
      *(undefined8 *)(local_40 + 0x38) = 8;
      *(undefined8 *)((long)puVar11 + lVar5 + 0x40) = *(undefined8 *)(local_40 + 0x40);
      *(undefined8 *)(local_40 + 0x40) = 0;
      *(undefined4 *)((long)puVar11 + lVar5 + 0x48) = 0xdeadbeef;
      *puVar16 = delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>
                 ::clone_func<Impl2T<poly::virtual_cloning_policy>>;
      puVar16[1] = (long)puVar11 + lVar5;
      puVar16[2] = (long)puVar11 + lVar5;
      puVar16[3] = 0x100;
      puVar16[4] = 0x40;
      puVar11 = *(undefined8 **)local_38;
      *(void_pointer *)local_38 = local_78._storage;
      pvVar3 = *(void_pointer *)(local_38 + 8);
      *(void_pointer *)(local_38 + 8) = local_78._end_storage;
      puVar2 = *(undefined8 **)(local_38 + 0x10);
      *(undefined8 **)(local_38 + 0x10) = puVar16 + 5;
      puStack_60 = *(undefined8 **)(local_38 + 0x18);
      *(undefined8 **)(local_38 + 0x18) = local_48;
      uVar6 = *(undefined8 *)(local_38 + 0x20);
      *(ulong *)(local_38 + 0x20) = local_58;
      local_78._storage = puVar11;
      local_78._end_storage = pvVar3;
      local_68 = puVar2;
      local_58 = uVar6;
      for (; puVar2 != puVar11; puVar11 = puVar11 + 5) {
        (**(code **)(*(long *)puVar11[2] + 0x18))();
        puVar11[2] = 0;
        puVar11[3] = 0;
        *puVar11 = 0;
        puVar11[1] = 0;
        puVar11[4] = 0;
      }
      local_58 = 8;
      puVar11 = (undefined8 *)local_78._storage;
      if (((ulong)((long)puStack_60 - (long)local_78._storage) / 5 & 0xfffffffffffffff8) * 5 != 0) {
        do {
          puVar11[3] = 0;
          puVar11[4] = 0;
          puVar11[1] = 0;
          puVar11[2] = 0;
          puVar11 = puVar11 + 5;
        } while (puVar11 !=
                 (undefined8 *)
                 ((long)local_78._storage +
                 ((ulong)((long)puStack_60 - (long)local_78._storage) / 0x28) * 5 * 8));
      }
      local_68 = (undefined8 *)0x0;
      puStack_60 = (undefined8 *)0x0;
      operator_delete(local_78._storage,(long)local_78._end_storage - (long)local_78._storage);
      local_78._storage = (void_pointer)0x0;
      local_78._end_storage = (void_pointer)0x0;
      operator_delete((void *)0x0,0);
      return;
    }
  }
  local_68 = puVar16;
  __assert_fail("can_construct_new_elem(s, a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5a9,
                "void poly::vector<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>, CloningPolicy = poly::delegate_cloning_policy<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>, T = Impl2T<poly::virtual_cloning_policy>, Args = <Impl2T<poly::virtual_cloning_policy>>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}